

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderValidateEntity(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  _xmlNode *p_Var2;
  xmlChar *str;
  xmlNodePtr *ppxVar3;
  int iVar4;
  xmlElementType xVar5;
  uint uVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr pxVar8;
  
  pxVar1 = reader->node;
  pxVar7 = pxVar1;
  do {
    xVar5 = pxVar7->type;
    if (xVar5 - XML_TEXT_NODE < 2) {
      str = pxVar7->content;
      iVar4 = xmlStrlen(str);
      xmlTextReaderValidateCData(reader,str,iVar4);
LAB_001a0de2:
      pxVar8 = pxVar7->children;
      if (pxVar8 == (xmlNodePtr)0x0) {
        if (pxVar7->type == XML_ELEMENT_NODE) {
          xmlTextReaderValidatePop(reader);
        }
LAB_001a0e1f:
        do {
          pxVar8 = pxVar7->next;
          if (pxVar8 != (xmlNodePtr)0x0) break;
          pxVar8 = pxVar7->parent;
          xVar5 = pxVar8->type;
          if (xVar5 == XML_ELEMENT_NODE) {
            if (reader->entNr == 0) {
              while ((pxVar7 = pxVar8->last, pxVar7 != (xmlNodePtr)0x0 && ((pxVar7->extra & 2) == 0)
                     )) {
                xmlUnlinkNode(pxVar7);
                xmlTextReaderFreeNode(reader,pxVar7);
              }
            }
            reader->node = pxVar8;
            xmlTextReaderValidatePop(reader);
            xVar5 = pxVar8->type;
          }
          if (((xVar5 == XML_ENTITY_DECL) && (reader->ent != (xmlNodePtr)0x0)) &&
             (reader->ent->children == pxVar8)) {
            iVar4 = reader->entNr;
            if ((long)iVar4 < 1) {
              pxVar8 = (xmlNodePtr)0x0;
            }
            else {
              uVar6 = iVar4 - 1;
              reader->entNr = uVar6;
              ppxVar3 = reader->entTab;
              if (iVar4 == 1) {
                pxVar7 = (xmlNodePtr)0x0;
              }
              else {
                pxVar7 = ppxVar3[(long)iVar4 + -2];
              }
              reader->ent = pxVar7;
              pxVar8 = ppxVar3[uVar6];
              ppxVar3[uVar6] = (xmlNodePtr)0x0;
            }
          }
          pxVar7 = pxVar8;
        } while (pxVar8 != pxVar1);
      }
    }
    else {
      if (xVar5 == XML_ELEMENT_NODE) {
        reader->node = pxVar7;
        xmlTextReaderValidatePush(reader);
        goto LAB_001a0de2;
      }
      if (xVar5 != XML_ENTITY_REF_NODE) goto LAB_001a0de2;
      p_Var2 = pxVar7->children;
      if (((p_Var2 == (_xmlNode *)0x0) || (p_Var2->type != XML_ENTITY_DECL)) ||
         (p_Var2->children == (_xmlNode *)0x0)) {
        if (pxVar7 != pxVar1) goto LAB_001a0e1f;
LAB_001a0edf:
        reader->node = pxVar1;
        return;
      }
      xmlTextReaderEntPush(reader,pxVar7);
      pxVar8 = pxVar7->children->children;
    }
    if ((pxVar8 == (xmlNodePtr)0x0) || (pxVar7 = pxVar8, pxVar8 == pxVar1)) goto LAB_001a0edf;
  } while( true );
}

Assistant:

static void
xmlTextReaderValidateEntity(xmlTextReaderPtr reader) {
    xmlNodePtr oldnode = reader->node;
    xmlNodePtr node = reader->node;

    do {
	if (node->type == XML_ENTITY_REF_NODE) {
	    if ((node->children != NULL) &&
		(node->children->type == XML_ENTITY_DECL) &&
		(node->children->children != NULL)) {
		xmlTextReaderEntPush(reader, node);
		node = node->children->children;
		continue;
	    } else {
		/*
		 * The error has probably been raised already.
		 */
		if (node == oldnode)
		    break;
                goto skip_children;
	    }
#ifdef LIBXML_REGEXP_ENABLED
	} else if (node->type == XML_ELEMENT_NODE) {
	    reader->node = node;
	    xmlTextReaderValidatePush(reader);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
#endif
	}

	/*
	 * go to next node
	 */
	if (node->children != NULL) {
	    node = node->children;
	    continue;
	} else if (node->type == XML_ELEMENT_NODE) {
	    xmlTextReaderValidatePop(reader);
	}
skip_children:
	if (node->next != NULL) {
	    node = node->next;
	    continue;
	}
	do {
	    node = node->parent;
	    if (node->type == XML_ELEMENT_NODE) {
	        xmlNodePtr tmp;
		if (reader->entNr == 0) {
		    while ((tmp = node->last) != NULL) {
			if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
			    xmlUnlinkNode(tmp);
			    xmlTextReaderFreeNode(reader, tmp);
			} else
			    break;
		    }
		}
		reader->node = node;
		xmlTextReaderValidatePop(reader);
	    }
	    if ((node->type == XML_ENTITY_DECL) &&
		(reader->ent != NULL) && (reader->ent->children == node)) {
		node = xmlTextReaderEntPop(reader);
	    }
	    if (node == oldnode)
		break;
	    if (node->next != NULL) {
		node = node->next;
		break;
	    }
	} while ((node != NULL) && (node != oldnode));
    } while ((node != NULL) && (node != oldnode));
    reader->node = oldnode;
}